

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_req_to_h2(dynhds *h2_headers,httpreq *req,Curl_easy *data)

{
  ulong uVar1;
  ulong uVar2;
  CURLcode CVar3;
  int iVar4;
  dynhds_entry *pdVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  dynhds *dynhds;
  long lVar10;
  char *__s;
  
  pcVar6 = req->scheme;
  if (pcVar6 == (char *)0x0) {
    iVar4 = strcmp("CONNECT",req->method);
    if (iVar4 == 0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = Curl_checkheaders(data,":scheme",7);
      if (pcVar6 == (char *)0x0) {
        if (data->conn == (connectdata *)0x0) {
          pcVar6 = "http";
        }
        else {
          pcVar6 = "https";
          if ((data->conn->handler->flags & 1) == 0) {
            pcVar6 = "http";
          }
        }
      }
      else {
        for (pcVar6 = pcVar6 + 8; (*pcVar6 == ' ' || (*pcVar6 == '\t')); pcVar6 = pcVar6 + 1) {
        }
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"set pseudo header %s to %s",":scheme",pcVar6);
        }
      }
    }
  }
  __s = req->authority;
  if (__s == (char *)0x0) {
    pdVar5 = Curl_dynhds_get(&req->headers,"Host",4);
    if (pdVar5 == (dynhds_entry *)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = pdVar5->value;
    }
  }
  Curl_dynhds_reset(h2_headers);
  Curl_dynhds_set_opts(h2_headers,1);
  sVar7 = strlen(req->method);
  CVar3 = Curl_dynhds_add(h2_headers,":method",7,req->method,sVar7);
  if ((CVar3 == CURLE_OK) && (pcVar6 != (char *)0x0)) {
    sVar7 = strlen(pcVar6);
    CVar3 = Curl_dynhds_add(h2_headers,":scheme",7,pcVar6,sVar7);
  }
  if ((CVar3 == CURLE_OK) && (__s != (char *)0x0)) {
    sVar7 = strlen(__s);
    CVar3 = Curl_dynhds_add(h2_headers,":authority",10,__s,sVar7);
  }
  if (CVar3 == CURLE_OK) {
    pcVar6 = req->path;
    if (pcVar6 == (char *)0x0) {
      CVar3 = CURLE_OK;
    }
    else {
      sVar7 = strlen(pcVar6);
      CVar3 = Curl_dynhds_add(h2_headers,":path",5,pcVar6,sVar7);
    }
  }
  if (CVar3 == CURLE_OK) {
    dynhds = &req->headers;
    sVar8 = Curl_dynhds_count(dynhds);
    if (sVar8 != 0) {
      sVar8 = 0;
      do {
        pdVar5 = Curl_dynhds_getn(dynhds,sVar8);
        pcVar6 = pdVar5->name;
        uVar1 = pdVar5->namelen;
        lVar10 = 8;
        do {
          uVar2 = *(ulong *)((long)&H2_NON_FIELD[0].name + lVar10);
          if (uVar1 < uVar2) break;
          if ((uVar2 == uVar1) &&
             (iVar4 = curl_strequal(*(char **)((long)&Curl_handler_https.family + lVar10),pcVar6),
             iVar4 != 0)) {
            CVar3 = CURLE_OK;
            goto LAB_0063b383;
          }
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x68);
        CVar3 = Curl_dynhds_add(h2_headers,pdVar5->name,pdVar5->namelen,pdVar5->value,
                                pdVar5->valuelen);
LAB_0063b383:
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        sVar8 = sVar8 + 1;
        sVar9 = Curl_dynhds_count(dynhds);
        CVar3 = CURLE_OK;
      } while (sVar8 < sVar9);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_http_req_to_h2(struct dynhds *h2_headers,
                             struct httpreq *req, struct Curl_easy *data)
{
  const char *scheme = NULL, *authority = NULL;
  struct dynhds_entry *e;
  size_t i;
  CURLcode result;

  DEBUGASSERT(req);
  DEBUGASSERT(h2_headers);

  if(req->scheme) {
    scheme = req->scheme;
  }
  else if(strcmp("CONNECT", req->method)) {
    scheme = Curl_checkheaders(data, STRCONST(HTTP_PSEUDO_SCHEME));
    if(scheme) {
      scheme += sizeof(HTTP_PSEUDO_SCHEME);
      while(*scheme && ISBLANK(*scheme))
        scheme++;
      infof(data, "set pseudo header %s to %s", HTTP_PSEUDO_SCHEME, scheme);
    }
    else {
      scheme = (data->conn && data->conn->handler->flags & PROTOPT_SSL)?
                "https" : "http";
    }
  }

  if(req->authority) {
    authority = req->authority;
  }
  else {
    e = Curl_dynhds_get(&req->headers, STRCONST("Host"));
    if(e)
      authority = e->value;
  }

  Curl_dynhds_reset(h2_headers);
  Curl_dynhds_set_opts(h2_headers, DYNHDS_OPT_LOWERCASE);
  result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_METHOD),
                           req->method, strlen(req->method));
  if(!result && scheme) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_SCHEME),
                             scheme, strlen(scheme));
  }
  if(!result && authority) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_AUTHORITY),
                             authority, strlen(authority));
  }
  if(!result && req->path) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_PATH),
                             req->path, strlen(req->path));
  }
  for(i = 0; !result && i < Curl_dynhds_count(&req->headers); ++i) {
    e = Curl_dynhds_getn(&req->headers, i);
    if(!h2_non_field(e->name, e->namelen)) {
      result = Curl_dynhds_add(h2_headers, e->name, e->namelen,
                               e->value, e->valuelen);
    }
  }

  return result;
}